

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O2

vector<boost::any,_std::allocator<boost::any>_> * __thiscall
Scine::Core::ModuleManager::Impl::getAll
          (vector<boost::any,_std::allocator<boost::any>_> *__return_storage_ptr__,Impl *this,
          string *interface,string *moduleName)

{
  pointer psVar1;
  element_type *peVar2;
  undefined8 uVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  pointer pLVar8;
  to_lowerF<char> tVar9;
  pointer pLVar10;
  pointer psVar11;
  _Alloc_hider _Var12;
  string modulePtrLower;
  string moduleNameLower;
  undefined1 local_a0 [8];
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tVar9.m_Loc = (locale *)moduleName;
  std::locale::locale((locale *)&local_78);
  boost::algorithm::detail::
  transform_range_copy<std::__cxx11::string,std::__cxx11::string,boost::algorithm::detail::to_lowerF<char>>
            (&local_50,(detail *)moduleName,&local_78,tVar9);
  std::locale::~locale((locale *)&local_78);
  if ((moduleName->_M_string_length == 0) || (bVar5 = std::operator!=(&local_50,"any"), !bVar5)) {
    pLVar10 = (this->_sources).
              super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pLVar8 = (this->_sources).
                  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  ._M_impl.super__Vector_impl_data._M_start; pLVar8 != pLVar10; pLVar8 = pLVar8 + 1)
    {
      psVar1 = (pLVar8->modules).
               super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar11 = (pLVar8->modules).
                     super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar1;
          psVar11 = psVar11 + 1) {
        peVar2 = (psVar11->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (**(code **)(*(long *)peVar2 + 0x30))(&local_78,peVar2,interface);
        sVar4 = local_78._M_string_length;
        for (_Var12._M_p = local_78._M_dataplus._M_p; _Var12._M_p != (pointer)sVar4;
            _Var12._M_p = _Var12._M_p + 0x20) {
          peVar2 = (psVar11->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          (**(code **)(*(long *)peVar2 + 0x18))((any *)local_98,peVar2,interface,_Var12._M_p);
          std::vector<boost::any,_std::allocator<boost::any>_>::emplace_back<boost::any>
                    (__return_storage_ptr__,(any *)local_98);
          if ((pointer)local_98._0_8_ != (pointer)0x0) {
            (**(code **)(*(long *)local_98._0_8_ + 8))();
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_78);
      }
    }
  }
  else {
    local_58 = (this->_sources).
               super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = false;
    for (pLVar8 = (this->_sources).
                  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  ._M_impl.super__Vector_impl_data._M_start; pLVar8 != local_58; pLVar8 = pLVar8 + 1
        ) {
      psVar11 = (pLVar8->modules).
                super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (pLVar8->modules).
               super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      tVar9.m_Loc = (locale *)local_58;
      while( true ) {
        if (psVar11 == psVar1) break;
        (**(code **)(*(long *)(psVar11->
                              super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + 0x10))
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
        std::locale::locale((locale *)local_a0);
        boost::algorithm::detail::
        transform_range_copy<std::__cxx11::string,std::__cxx11::string,boost::algorithm::detail::to_lowerF<char>>
                  (&local_78,(detail *)local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   tVar9);
        std::locale::~locale((locale *)local_a0);
        std::__cxx11::string::~string((string *)local_98);
        bVar6 = std::operator!=(&local_78,&local_50);
        if (bVar6) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,&local_50,"module");
          bVar7 = std::operator!=(&local_78,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_98);
          std::__cxx11::string::~string((string *)local_98);
          bVar6 = true;
          if (!bVar7) goto LAB_0010cdd5;
        }
        else {
LAB_0010cdd5:
          peVar2 = (psVar11->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          (**(code **)(*(long *)peVar2 + 0x30))(local_98,peVar2,interface);
          uVar3 = local_98._8_8_;
          for (pLVar10 = (pointer)local_98._0_8_; pLVar10 != (pointer)uVar3; pLVar10 = pLVar10 + 1)
          {
            peVar2 = (psVar11->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            tVar9.m_Loc = (locale *)pLVar10;
            (**(code **)(*(long *)peVar2 + 0x18))
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,peVar2,interface);
            std::vector<boost::any,_std::allocator<boost::any>_>::emplace_back<boost::any>
                      (__return_storage_ptr__,(any *)local_a0);
            if (local_a0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_a0 + 8))();
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_98);
          bVar5 = true;
          bVar6 = false;
        }
        std::__cxx11::string::~string((string *)&local_78);
        psVar11 = psVar11 + 1;
        if (!bVar6) {
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar5) {
            return __return_storage_ptr__;
          }
          std::vector<boost::any,_std::allocator<boost::any>_>::~vector(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<boost::any> getAll(const std::string& interface, const std::string& moduleName) const {
    std::vector<boost::any> models;

    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          for (const auto& model : modulePtr->announceModels(interface)) {
            models.push_back(modulePtr->get(interface, model));
          }

          return models;
        }
      }
      return models;
    }

    for (const auto& source : _sources) {
      for (const auto& modulePtr : source.modules) {
        for (const auto& model : modulePtr->announceModels(interface)) {
          models.push_back(modulePtr->get(interface, model));
        }
      }
    }

    return models;
  }